

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

int32_t __thiscall GameEngine::registerPlayer(GameEngine *this,string *name)

{
  int32_t iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __lhs;
  __type _Var2;
  size_type sVar3;
  element_type *peVar4;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int32_t local_2c;
  undefined1 local_28 [4];
  int32_t id;
  shared_ptr<Player> player;
  string *name_local;
  GameEngine *this_local;
  
  player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name;
  std::make_shared<Player>();
  sVar3 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::size
                    (&this->players);
  local_2c = (int32_t)sVar3;
  peVar4 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  Player::SetId(peVar4,local_2c);
  __lhs = player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Bot",&local_61);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __lhs._M_pi,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (_Var2) {
    peVar4 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                   " ");
    std::__cxx11::to_string(&local_c8,local_2c);
    std::operator+(&local_88,&local_a8,&local_c8);
    Player::SetName(peVar4,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    peVar4 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    Player::SetName(peVar4,(string *)
                           player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi);
  }
  peVar4 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_28);
  Player::generatePopulations(peVar4);
  std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::push_back
            (&this->players,(value_type *)local_28);
  iVar1 = local_2c;
  std::shared_ptr<Player>::~shared_ptr((shared_ptr<Player> *)local_28);
  return iVar1;
}

Assistant:

int32_t GameEngine::registerPlayer(const std::string &name) {
  std::shared_ptr<Player> player = std::make_shared<Player>();
  int32_t id = players.size();
  player->SetId(id);

  if (name == std::string("Bot")) {
    player->SetName(name + " " + std::to_string(id));
  } else {
    player->SetName(name);
  }

  player->generatePopulations();

  players.push_back(std::move(player));

  return id;
}